

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * google::protobuf::anon_unknown_23::EnumValueToPascalCase
                   (string *__return_storage_ptr__,string *input)

{
  uchar c;
  bool bVar1;
  bool bVar2;
  uchar *puVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_48;
  char character;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  bool next_upper;
  string *input_local;
  string *result;
  
  bVar1 = true;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  __end2._M_current = (char *)std::__cxx11::string::begin();
  _Stack_48._M_current = (char *)std::__cxx11::string::end();
  while (bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffb8), bVar2) {
    puVar3 = (uchar *)__gnu_cxx::
                      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*(&__end2);
    c = *puVar3;
    if (c == '_') {
      bVar1 = true;
    }
    else {
      if (bVar1) {
        absl::lts_20240722::ascii_toupper(c);
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      else {
        absl::lts_20240722::ascii_tolower(c);
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      bVar1 = false;
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EnumValueToPascalCase(const std::string& input) {
  bool next_upper = true;
  std::string result;
  result.reserve(input.size());

  for (char character : input) {
    if (character == '_') {
      next_upper = true;
    } else {
      if (next_upper) {
        result.push_back(absl::ascii_toupper(character));
      } else {
        result.push_back(absl::ascii_tolower(character));
      }
      next_upper = false;
    }
  }

  return result;
}